

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::get_cur_nodes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this)

{
  int v;
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->cur_num_nodes != 0) {
    local_1c = this->cur_first_node;
    do {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
      local_1c = this->cur_nodes_next[local_1c];
    } while (local_1c != this->cur_first_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::get_cur_nodes() {
    std::vector<int> ret;
    if (cur_num_nodes) {
        int v = cur_first_node;
        for (;;) {
            ret.push_back(v);
            v = cur_nodes_next[v];
            if (v == cur_first_node)
                break;
        }
    }
    return ret;
}